

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleFromVoxels.h
# Opt level: O0

bool __thiscall
nanovdb::
TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
::update<nanovdb::Vec3<float>>
          (TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>_>
           *this,Vec3<float> *xyz)

{
  ValueType *pVVar1;
  ValueType *pVVar2;
  Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
  *in_RDI;
  Coord CVar3;
  CoordT ijk;
  CoordType *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd4;
  Coord *local_24;
  int32_t local_1c;
  bool local_1;
  
  CVar3 = Floor<nanovdb::Coord,nanovdb::Vec3>((Vec3<float> *)in_RDI);
  local_24 = CVar3.mVec._0_8_;
  local_1c = CVar3.mVec[2];
  local_1 = Coord::operator==((Coord *)CONCAT44(in_stack_ffffffffffffffd4,local_1c),local_24);
  if (!local_1) {
    (in_RDI->super_TreeData<3>).mBytes[1] = (uint64_t)local_24;
    *(int32_t *)((in_RDI->super_TreeData<3>).mBytes + 2) = local_1c;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    *(ValueType *)((long)(in_RDI->super_TreeData<3>).mBytes + 0x14) = *pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,2);
    *pVVar2 = *pVVar2 + 1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    *(ValueType *)((in_RDI->super_TreeData<3>).mBytes + 3) = *pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,1);
    *pVVar2 = *pVVar2 + 1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    (in_RDI->super_TreeData<3>).mCount[0] = (uint32_t)*pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,2);
    *pVVar2 = *pVVar2 + -1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    *(ValueType *)((long)(in_RDI->super_TreeData<3>).mBytes + 0x1c) = *pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,0);
    *pVVar2 = *pVVar2 + 1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,1);
    *pVVar2 = *pVVar2 + -1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    (in_RDI->super_TreeData<3>).mCount[1] = (uint32_t)*pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,2);
    *pVVar2 = *pVVar2 + 1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    (in_RDI->super_TreeData<3>).mCount[2] = (uint32_t)*pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,1);
    *pVVar2 = *pVVar2 + 1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    *(ValueType *)&(in_RDI->super_TreeData<3>).field_0x30 = *pVVar1;
    pVVar2 = Coord::operator[]((Coord *)&local_24,2);
    *pVVar2 = *pVVar2 + -1;
    pVVar1 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(in_RDI,in_stack_ffffffffffffffb8);
    (in_RDI->super_TreeData<3>).mCount[3] = (uint32_t)*pVVar1;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool TrilinearSampler<TreeOrAccT>::update(Vec3T& xyz)
{
    CoordT ijk = Floor<CoordT>(xyz);

    if (ijk == mPos)
        return false; // early out - reuse cached values

    mPos = ijk;

    mVal[0][0][0] = mAcc->getValue(ijk); // i, j, k

    ijk[2] += 1;
    mVal[0][0][1] = mAcc->getValue(ijk); // i, j, k + 1

    ijk[1] += 1;
    mVal[0][1][1] = mAcc->getValue(ijk); // i, j+1, k + 1

    ijk[2] -= 1;
    mVal[0][1][0] = mAcc->getValue(ijk); // i, j+1, k

    ijk[0] += 1;
    ijk[1] -= 1;
    mVal[1][0][0] = mAcc->getValue(ijk); // i+1, j, k

    ijk[2] += 1;
    mVal[1][0][1] = mAcc->getValue(ijk); // i+1, j, k + 1

    ijk[1] += 1;
    mVal[1][1][1] = mAcc->getValue(ijk); // i+1, j+1, k + 1

    ijk[2] -= 1;
    mVal[1][1][0] = mAcc->getValue(ijk); // i+1, j+1, k

    return true;
}